

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::doAddRow
          (SPxLPBase<double> *this,double *lhsValue,SVectorBase<double> *rowVec,double *rhsValue,
          bool scale)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Item *pIVar4;
  Nonzero<double> *pNVar5;
  bool bVar6;
  undefined7 in_register_00000081;
  int iVar7;
  long in_FS_OFFSET;
  double dVar8;
  double __x;
  int idx;
  double val;
  int local_ac;
  int local_8c;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  DataKey local_70;
  LPColBase<double> local_68;
  
  iVar2 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar3 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_70.info = 0;
  local_70.idx = 0;
  local_78 = (double)((ulong)local_78 & 0xffffffff00000000);
  local_68.up = -NAN;
  local_8c = iVar2;
  LPRowSetBase<double>::add
            (&this->super_LPRowSetBase<double>,(DataKey *)&local_68,lhsValue,rowVec,rhsValue,
             (double *)&local_70,(int *)&local_78);
  if ((int)CONCAT71(in_register_00000081,scale) == 0) {
    local_ac = 0;
  }
  else {
    local_ac = (*this->lp_scaler->_vptr_SPxScaler[1])
                         (this->lp_scaler,rowVec,&(this->super_LPColSetBase<double>).scaleExp);
    local_88 = (this->super_LPRowSetBase<double>).right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar2];
    ::soplex::infinity::__tls_init();
    dVar8 = *(double *)(in_FS_OFFSET + -8);
    uStack_80 = 0;
    bVar6 = local_88 < dVar8;
    local_88 = dVar8;
    if (bVar6) {
      dVar8 = ldexp((this->super_LPRowSetBase<double>).right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2],local_ac);
      (this->super_LPRowSetBase<double>).right.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar2] = dVar8;
    }
    dVar8 = (this->super_LPRowSetBase<double>).left.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar2];
    ::soplex::infinity::__tls_init();
    if (-local_88 < dVar8) {
      dVar8 = ldexp((this->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2],local_ac);
      (this->super_LPRowSetBase<double>).left.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar2] = dVar8;
    }
    dVar8 = ldexp((this->super_LPRowSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2],local_ac);
    (this->super_LPRowSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [iVar2] = dVar8;
    (this->super_LPRowSetBase<double>).scaleExp.data[iVar2] = local_ac;
  }
  pIVar4 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar2 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx;
  dVar8 = (double)(long)pIVar4[iVar2].data.super_SVectorBase<double>.memused;
  if (0 < (long)dVar8) {
    pIVar4 = pIVar4 + iVar2;
    do {
      dVar1 = (double)((long)dVar8 + -1);
      pNVar5 = (pIVar4->data).super_SVectorBase<double>.m_elem;
      iVar2 = pNVar5[(long)dVar1].idx;
      __x = pNVar5[(long)dVar1].val;
      local_88 = dVar1;
      if (scale) {
        __x = ldexp(__x,(this->super_LPColSetBase<double>).scaleExp.data[iVar2] + local_ac);
        (pIVar4->data).super_SVectorBase<double>.m_elem[(long)dVar1].val = __x;
      }
      local_78 = __x;
      if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar2) {
        LPColBase<double>::LPColBase(&local_68,0);
        iVar7 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (iVar7 <= iVar2) {
          iVar7 = (iVar2 - iVar7) + 1;
          do {
            local_70.info = 0;
            local_70.idx = -1;
            LPColSetBase<double>::add(&this->super_LPColSetBase<double>,&local_70,&local_68);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069e2b8;
        if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
          free(local_68.vec.theelem);
        }
      }
      SVSetBase<double>::add2
                (&(this->super_LPColSetBase<double>).super_SVSetBase<double>,
                 (SVectorBase<double> *)
                 ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx),1
                 ,&local_8c,&local_78);
      bVar6 = 1 < (long)dVar8;
      dVar8 = local_88;
    } while (bVar6);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar3));
  return;
}

Assistant:

void doAddRow(const R& lhsValue, const SVectorBase<R>& rowVec, const R& rhsValue,
                 bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(lhsValue, rowVec, rhsValue);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(rowVec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      SVectorBase<R>& vec = rowVector_w(idx);

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }